

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O1

int multifast_replace(AC_TRIE_t *thiz,AC_TEXT_t *instr,MF_REPLACE_MODE_t mode,
                     MF_REPLACE_CALBACK_f callback,void *param)

{
  ACT_NODE_t *pAVar1;
  AC_PATTERN_t *pAVar2;
  ac_trie *paVar3;
  AC_TEXT_t *pAVar4;
  ACT_NODE_t *pAVar5;
  mf_replacement_nominee *pmVar6;
  ulong uVar7;
  size_t sVar8;
  size_t *psVar9;
  size_t __n;
  ulong uVar10;
  ulong to_position;
  ACT_NODE_t *nod;
  int iVar11;
  size_t sVar12;
  
  iVar11 = -1;
  if (thiz->trie_open == 0) {
    if ((thiz->repdata).has_replacement == 0) {
      iVar11 = -2;
    }
    else {
      (thiz->repdata).cbf = callback;
      (thiz->repdata).user = param;
      (thiz->repdata).replace_mode = mode;
      thiz->text = instr;
      nod = thiz->last_node;
      uVar7 = instr->length;
      uVar10 = 0;
      if (uVar7 != 0) {
        do {
          pAVar5 = node_find_next_bs(nod,instr->astring[uVar10]);
          if (pAVar5 == (ACT_NODE_t *)0x0) {
            pAVar1 = nod->failure_node;
            uVar7 = (ulong)(pAVar1 == (ACT_NODE_t *)0x0);
            if (pAVar1 != (ACT_NODE_t *)0x0) {
              nod = pAVar1;
            }
          }
          else {
            uVar7 = 1;
            nod = pAVar5;
          }
          uVar10 = uVar10 + uVar7;
          if (((pAVar5 != (ACT_NODE_t *)0x0) && (nod->final != 0)) &&
             (pAVar2 = nod->to_be_replaced, pAVar2 != (AC_PATTERN_t *)0x0)) {
            sVar12 = thiz->base_position + uVar10;
            uVar7 = sVar12 - (pAVar2->ptext).length;
            if ((thiz->repdata).replace_mode == MF_REPLACE_MODE_LAZY) {
              if ((uVar7 < (thiz->repdata).curser) ||
                 ((sVar8 = (thiz->repdata).noms_size, sVar8 != 0 &&
                  (uVar7 < (thiz->repdata).noms[sVar8 - 1].position)))) goto LAB_001097fb;
            }
            else {
              sVar8 = (thiz->repdata).noms_size;
              if (sVar8 != 0) {
                psVar9 = &(thiz->repdata).noms[sVar8 - 1].position;
                do {
                  sVar8 = sVar8 - 1;
                  if (*psVar9 - (((mf_replacement_nominee *)(psVar9 + -1))->pattern->ptext).length <
                      uVar7) break;
                  (thiz->repdata).noms_size = sVar8;
                  psVar9 = psVar9 + -2;
                } while (sVar8 != 0);
              }
            }
            sVar8 = (thiz->repdata).noms_capacity;
            if ((thiz->repdata).noms_size == sVar8) {
              if (sVar8 == 0) {
                (thiz->repdata).noms_capacity = 0x80;
                pmVar6 = (mf_replacement_nominee *)malloc(0x800);
                (thiz->repdata).noms = pmVar6;
                (thiz->repdata).noms_size = 0;
              }
              else {
                (thiz->repdata).noms_capacity = sVar8 + 0x80;
                pmVar6 = (mf_replacement_nominee *)
                         realloc((thiz->repdata).noms,(sVar8 + 0x80) * 0x10);
                (thiz->repdata).noms = pmVar6;
              }
            }
            pmVar6 = (thiz->repdata).noms;
            sVar8 = (thiz->repdata).noms_size;
            pmVar6[sVar8].pattern = pAVar2;
            pmVar6[sVar8].position = sVar12;
            (thiz->repdata).noms_size = sVar8 + 1;
          }
LAB_001097fb:
          uVar7 = instr->length;
        } while (uVar10 < uVar7);
      }
      to_position = (uVar7 + thiz->base_position) - nod->depth;
      mf_repdata_do_replace(&thiz->repdata,to_position);
      paVar3 = (thiz->repdata).trie;
      pAVar4 = paVar3->text;
      iVar11 = 0;
      psVar9 = &paVar3->base_position;
      uVar7 = 0;
      if (*psVar9 <= to_position) {
        uVar7 = to_position - *psVar9;
      }
      __n = pAVar4->length - uVar7;
      if (uVar7 <= pAVar4->length && __n != 0) {
        memcpy((thiz->repdata).backlog.astring + (thiz->repdata).backlog.length,
               pAVar4->astring + uVar7,__n);
        psVar9 = &(thiz->repdata).backlog.length;
        *psVar9 = *psVar9 + (pAVar4->length - uVar7);
      }
      thiz->last_node = nod;
      thiz->base_position = thiz->base_position + uVar10;
    }
  }
  return iVar11;
}

Assistant:

int multifast_replace (AC_TRIE_t *thiz, AC_TEXT_t *instr, 
        MF_REPLACE_MODE_t mode, MF_REPLACE_CALBACK_f callback, void *param)
{
    ACT_NODE_t *current;
    ACT_NODE_t *next;
    struct mf_replacement_nominee nom;
    MF_REPLACEMENT_DATA_t *rd = &thiz->repdata;
    
    size_t position_r = 0;  /* Relative current position in the input string */
    size_t backlog_pos = 0; /* Relative backlog position in the input string */
    
    if (thiz->trie_open)
        return -1; /* _finalize() must be called first */
    
    if (!rd->has_replacement)
        return -2; /* Trie doesn't have any to-be-replaced pattern */
    
    rd->cbf = callback;
    rd->user = param;
    rd->replace_mode = mode;
    
    thiz->text = instr; /* Save the input string in a helper variable 
                         * for convenience */
    
    current = thiz->last_node;
    
    /* Main replace loop: 
     * Find patterns and bookmark them 
     */
    while (position_r < instr->length)
    {
        if (!(next = node_find_next_bs(current, instr->astring[position_r])))
        {
            /* Failed to follow a pattern */
            if(current->failure_node)
                current = current->failure_node;
            else
                position_r++;
        }
        else
        {
            current = next;
            position_r++;
        }
        
        if (current->final && next)
        {
            /* Bookmark nominee patterns for replacement */
            nom.pattern = current->to_be_replaced;
            nom.position = thiz->base_position + position_r;
            
            mf_repdata_booknominee (rd, &nom);
        }
    }
    
    /* 
     * At the end of input chunk, if the tail of the chunk is a prefix of a
     * pattern, then we must keep it in the backlog buffer and wait for the 
     * next chunk to decide about it. */
    
    backlog_pos = thiz->base_position + instr->length - current->depth;
    
    /* Now replace the patterns up to the backlog_pos point */
    mf_repdata_do_replace (rd, backlog_pos);
    
    /* Save the remaining to the backlog buffer */
    mf_repdata_savetobacklog (rd, backlog_pos);
    
    /* Save status variables */
    thiz->last_node = current;
    thiz->base_position += position_r;
    
    return 0;
}